

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O2

Ret * __thiscall
axl::sl::Array<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>::
insertSpace(Array<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
            *this,size_t index,size_t count)

{
  ulong uVar1;
  bool bVar2;
  Ret *dst;
  size_t sVar3;
  
  uVar1 = (this->
          super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
          ).m_count;
  bVar2 = setCountImpl<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Construct>
                    (this,uVar1 + count);
  if (bVar2) {
    sVar3 = index;
    if (uVar1 < index) {
      sVar3 = uVar1;
    }
    dst = (this->
          super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
          ).m_p + sVar3;
    if (count != 0 && index < uVar1) {
      ArrayDetails<axl::spy::ThreadState::Ret>::copy
                ((ArrayDetails<axl::spy::ThreadState::Ret> *)(dst + count),(EVP_PKEY_CTX *)dst,
                 (EVP_PKEY_CTX *)(uVar1 - sVar3));
    }
  }
  else {
    dst = (Ret *)0x0;
  }
  return dst;
}

Assistant:

T*
	insertSpace(
		size_t index,
		size_t count
	) {
		size_t oldCount = this->m_count;
		bool result = setCount(this->m_count + count);
		if (!result)
			return NULL;

		if (index > oldCount)
			index = oldCount;

		T* dst = this->m_p + index;

		if (count && index < oldCount)
			Details::copy(dst + count, dst, oldCount - index);

		return dst;
	}